

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O3

void __thiscall despot::EvalLog::Save(EvalLog *this)

{
  ostream *poVar1;
  pointer pbVar2;
  long *plVar3;
  ulong uVar4;
  long lVar5;
  ofstream fout;
  undefined1 local_230 [248];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(local_230,(this->log_file_)._M_dataplus._M_p,_S_out);
  poVar1 = std::ostream::_M_insert<long>((long)local_230);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_230);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  pbVar2 = (this->runned_instances).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->runned_instances).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar2) {
    lVar5 = 8;
    uVar4 = 0;
    do {
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_230,*(char **)((long)pbVar2 + lVar5 + -8),
                          *(long *)((long)&(pbVar2->_M_dataplus)._M_p + lVar5));
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      plVar3 = (long *)std::ostream::operator<<
                                 (poVar1,(this->num_of_completed_runs).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start[uVar4]);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
      uVar4 = uVar4 + 1;
      pbVar2 = (this->runned_instances).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x20;
    } while (uVar4 < (ulong)((long)(this->runned_instances).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5));
  }
  std::ofstream::close();
  local_230._0_8_ = _VTT;
  *(undefined8 *)(local_230 + (long)_VTT[-3]) = _sqrt;
  std::filebuf::~filebuf((filebuf *)(local_230 + 8));
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void EvalLog::Save() {
	ofstream fout(log_file_.c_str(), ofstream::out);
	fout << start_time << endl;
	fout << runned_instances.size() << endl;
	for (int i = 0; i < runned_instances.size(); i++)
		fout << runned_instances[i] << " " << num_of_completed_runs[i] << endl;
	fout.close();
}